

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O3

bool absl::lts_20240722::flags_internal::AbslParseFlag(string_view text,bool *dst,string *param_3)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  undefined **ppuVar9;
  ulong uVar10;
  bool bVar11;
  string_view sVar12;
  
  sVar12._M_len = text._M_str;
  sVar12._M_str = dst;
  sVar12 = StripLeadingAsciiWhitespace((lts_20240722 *)text._M_len,sVar12);
  pcVar5 = sVar12._M_str;
  uVar7 = sVar12._M_len;
  pcVar4 = pcVar5 + uVar7;
  pcVar8 = pcVar4;
  if (0 < (long)uVar7 >> 2) {
    pcVar8 = pcVar5 + ((uint)sVar12._M_len & 3);
    lVar6 = ((long)uVar7 >> 2) + 1;
    do {
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar4[-1]) & 8) == 0)
      goto LAB_00104636;
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar4[-2]) & 8) == 0) {
        pcVar4 = pcVar4 + -1;
        goto LAB_00104636;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar4[-3]) & 8) == 0) {
        pcVar4 = pcVar4 + -2;
        goto LAB_00104636;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar4[-4]) & 8) == 0) {
        pcVar4 = pcVar4 + -3;
        goto LAB_00104636;
      }
      pcVar4 = pcVar4 + -4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar8 - (long)pcVar5;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pcVar4 = pcVar5;
      if ((lVar6 != 3) ||
         (pcVar4 = pcVar8,
         (*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar8[-1]) & 8) == 0))
      goto LAB_00104636;
      pcVar8 = pcVar8 + -1;
    }
    pcVar4 = pcVar8;
    if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar8[-1]) & 8) == 0)
    goto LAB_00104636;
    pcVar8 = pcVar8 + -1;
  }
  pcVar4 = pcVar8;
  if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar8[-1]) & 8) != 0) {
    pcVar4 = pcVar5;
  }
LAB_00104636:
  uVar10 = (long)pcVar4 - (long)pcVar5;
  if (uVar7 < (ulong)((long)pcVar4 - (long)pcVar5)) {
    uVar10 = uVar7;
  }
  cVar1 = absl::lts_20240722::EqualsIgnoreCase(uVar10,pcVar5,1,"1");
  bVar11 = true;
  bVar3 = true;
  if (cVar1 == '\0') {
    bVar11 = true;
    ppuVar9 = &PTR_anon_var_dwarf_a1_00109cd0;
    uVar7 = 0;
    do {
      sVar2 = strlen(*ppuVar9);
      cVar1 = absl::lts_20240722::EqualsIgnoreCase(uVar10,pcVar5,sVar2);
      if (cVar1 != '\0') {
        bVar3 = false;
        goto LAB_001046d5;
      }
      bVar11 = uVar7 < 4;
      if (uVar7 == 4) {
        return false;
      }
      pcVar4 = (char *)(&DAT_00109ca8)[uVar7];
      sVar2 = strlen(pcVar4);
      cVar1 = absl::lts_20240722::EqualsIgnoreCase(uVar10,pcVar5,sVar2,pcVar4);
      ppuVar9 = ppuVar9 + 1;
      uVar7 = uVar7 + 1;
    } while (cVar1 == '\0');
    bVar3 = true;
  }
LAB_001046d5:
  *dst = bVar3;
  return bVar11;
}

Assistant:

bool AbslParseFlag(absl::string_view text, bool* dst, std::string*) {
  const char* kTrue[] = {"1", "t", "true", "y", "yes"};
  const char* kFalse[] = {"0", "f", "false", "n", "no"};
  static_assert(sizeof(kTrue) == sizeof(kFalse), "true_false_equal");

  text = absl::StripAsciiWhitespace(text);

  for (size_t i = 0; i < ABSL_ARRAYSIZE(kTrue); ++i) {
    if (absl::EqualsIgnoreCase(text, kTrue[i])) {
      *dst = true;
      return true;
    } else if (absl::EqualsIgnoreCase(text, kFalse[i])) {
      *dst = false;
      return true;
    }
  }
  return false;  // didn't match a legal input
}